

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O0

bool __thiscall cmArchiveWrite::Open(cmArchiveWrite *this)

{
  int iVar1;
  ulong uVar2;
  string local_b8;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  string local_38;
  cmArchiveWrite *local_18;
  cmArchiveWrite *this_local;
  
  local_18 = this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = archive_write_open(this->Archive,this,(undefined1 *)0x0,Callback::Write,
                               (undefined1 *)0x0);
    if (iVar1 == 0) {
      this_local._7_1_ = true;
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_68,"archive_write_open: ");
      cm_archive_error_string_abi_cxx11_(&local_b8,this->Archive);
      cmAlphaNum::cmAlphaNum(&local_98,&local_b8);
      cmStrCat<>(&local_38,&local_68,&local_98);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_b8);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmArchiveWrite::Open()
{
  if (!this->Error.empty()) {
    return false;
  }
  if (archive_write_open(
        this->Archive, this, nullptr,
        reinterpret_cast<archive_write_callback*>(&Callback::Write),
        nullptr) != ARCHIVE_OK) {
    this->Error =
      cmStrCat("archive_write_open: ", cm_archive_error_string(this->Archive));
    return false;
  }
  return true;
}